

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info.h
# Opt level: O0

void __thiscall
bloaty::dwarf::CompilationUnitSizes::SetAddressSize(CompilationUnitSizes *this,uint8_t address_size)

{
  char in_SIL;
  char *in_RDI;
  int value;
  Arg *in_stack_ffffffffffffff80;
  Arg *in_stack_ffffffffffffff98;
  string_view in_stack_ffffffffffffffa0;
  
  if ((in_SIL != '\x04') && (in_SIL != '\b')) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&in_stack_ffffffffffffff80->piece_,in_RDI);
    value = (int)((ulong)in_RDI >> 0x20);
    absl::substitute_internal::Arg::Arg(in_stack_ffffffffffffff80,value);
    absl::Substitute_abi_cxx11_(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    std::__cxx11::string::c_str();
    Throw((char *)in_stack_ffffffffffffff80,value);
  }
  in_RDI[3] = in_SIL == '\b';
  return;
}

Assistant:

void SetAddressSize(uint8_t address_size) {
    if (address_size != 4 && address_size != 8) {
      THROWF("Unexpected address size: $0", address_size);
    }
    addr8_ = address_size == 8;
  }